

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  undefined1 local_260 [40];
  string local_238 [32];
  undefined1 local_218 [40];
  string local_1f0 [32];
  undefined1 local_1d0 [40];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"admin",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"test1",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"1",&local_91);
  DirMan::CreatDir(&Dirs,(string *)local_30,(string *)local_68,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"test1",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa",&local_e1);
  diskmanager::CreateFile(&A_Disk,(string *)local_b8,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"admin",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"test2",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"1",&local_159);
  DirMan::CreatDir(&Dirs,(string *)local_108,(string *)local_130,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"test2",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"dsfasdf",(allocator *)(local_1d0 + 0x27));
  diskmanager::CreateFile(&A_Disk,(string *)local_180,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d0 + 0x27));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  DirMan::ShowDirMan(&Dirs);
  poVar1 = std::operator<<((ostream *)&std::cout,"Data is ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"test1",(allocator *)(local_218 + 0x27));
  diskmanager::ReadFile((diskmanager *)local_1d0,(string *)&A_Disk);
  poVar1 = std::operator<<(poVar1,(string *)local_1d0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0x27));
  poVar1 = std::operator<<((ostream *)&std::cout,"Data is ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"test2",(allocator *)(local_260 + 0x27));
  diskmanager::ReadFile((diskmanager *)local_218,(string *)&A_Disk);
  poVar1 = std::operator<<(poVar1,(string *)local_218);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)(local_260 + 0x27));
  poVar1 = std::operator<<((ostream *)&std::cout,"After Delete ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"test1",&local_281);
  diskmanager::ReadFile((diskmanager *)local_260,(string *)&A_Disk);
  poVar1 = std::operator<<(poVar1,(string *)local_260);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"test2",&local_2a9);
  Memory::Alloc(&Mems,3,(string *)local_2a8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  Memory::show(&Mems);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"test1",&local_2d1);
  Memory::Alloc(&Mems,5,(string *)local_2d0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  Memory::show(&Mems);
  return 0;
}

Assistant:

int main(){
  // 目录管理和磁盘管理测试
  Dirs.CreatDir("admin", "test1", "1");
  A_Disk.CreateFile("test1", "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa");
  Dirs.CreatDir("admin", "test2", "1");
  A_Disk.CreateFile("test2", "dsfasdf");
  Dirs.ShowDirMan();
  cout << "Data is " << A_Disk.ReadFile("test1") << endl;
  cout << "Data is " << A_Disk.ReadFile("test2") << endl;
//  Dirs.DelFile("test1");
  cout << "After Delete " << A_Disk.ReadFile("test1") << endl;

  //
  cout << "--------------" << endl;
  Mems.Alloc(3, "test2");
  Mems.show();
  cout << "--------------" << endl;
  Mems.Alloc(5, "test1");
  Mems.show();
  return 0;
}